

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O2

void __thiscall
InsertProxyModel::setSourceModel(InsertProxyModel *this,QAbstractItemModel *newSourceModel)

{
  QVector<QMetaObject::Connection> *this_00;
  InsertProxyModelPrivate *pIVar1;
  int iVar2;
  int iVar3;
  QAbstractItemModel *pQVar4;
  long lVar5;
  Connection *pCVar6;
  void **ppvVar7;
  undefined4 *puVar8;
  Function signal;
  long *plVar9;
  Connection *pCVar10;
  int iVar11;
  bool bVar12;
  undefined8 in_stack_ffffffffffffff08;
  undefined4 uVar14;
  int *piVar13;
  QMap<int,_QVariant> local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  Connection local_c8;
  Connection local_c0;
  Connection local_b8;
  Connection local_b0;
  Connection local_a8;
  Connection local_a0;
  Connection local_98;
  Connection local_90;
  Connection local_88;
  Connection local_80;
  Connection local_78;
  Connection local_70;
  Connection local_68;
  Connection local_60;
  Connection local_58;
  Connection local_50;
  Connection local_48;
  Connection local_40;
  Connection local_38;
  
  pQVar4 = (QAbstractItemModel *)QAbstractProxyModel::sourceModel();
  if (pQVar4 != newSourceModel) {
    pIVar1 = this->m_dptr;
    QAbstractItemModel::beginResetModel();
    lVar5 = QAbstractProxyModel::sourceModel();
    if (lVar5 != 0) {
      pCVar6 = (pIVar1->m_sourceConnections).d.ptr;
      for (pCVar10 = pCVar6; pCVar10 != pCVar6 + (pIVar1->m_sourceConnections).d.size;
          pCVar10 = pCVar10 + 1) {
        QObject::disconnect(pCVar10);
        pCVar6 = (pIVar1->m_sourceConnections).d.ptr;
      }
    }
    QAbstractProxyModel::setSourceModel((QAbstractItemModel *)this);
    this_00 = &pIVar1->m_sourceConnections;
    QList<QMetaObject::Connection>::clear(this_00);
    for (lVar5 = 0x68; uVar14 = (undefined4)((ulong)in_stack_ffffffffffffff08 >> 0x20),
        lVar5 != 0x98; lVar5 = lVar5 + 0x18) {
      QList<QMap<int,_QVariant>_>::clear
                ((QList<QMap<int,_QVariant>_> *)((long)pIVar1->m_extraData + lVar5 + -0x68));
    }
    lVar5 = QAbstractProxyModel::sourceModel();
    if (lVar5 != 0) {
      ppvVar7 = (void **)QAbstractProxyModel::sourceModel();
      local_e0.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QObject::destroyed;
      uStack_d8 = 0;
      puVar8 = (undefined4 *)operator_new(0x18);
      *puVar8 = 1;
      *(code **)(puVar8 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:268:84),_0,_QtPrivate::List<>,_void>
           ::impl;
      *(InsertProxyModel **)(puVar8 + 4) = this;
      piVar13 = (int *)CONCAT44(uVar14,1);
      QObject::connectImpl
                ((QObject *)&local_38,ppvVar7,(QObject *)&local_e0,ppvVar7,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar8,piVar13,(QMetaObject *)0x0);
      uVar14 = (undefined4)((ulong)piVar13 >> 0x20);
      QList<QMetaObject::Connection>::emplaceBack<QMetaObject::Connection>(this_00,&local_38);
      ppvVar7 = (void **)QAbstractProxyModel::sourceModel();
      local_e0.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::dataChanged;
      uStack_d8 = 0;
      puVar8 = (undefined4 *)operator_new(0x18);
      *puVar8 = 1;
      *(code **)(puVar8 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:270:37),_3,_QtPrivate::List<const_QModelIndex_&,_const_QModelIndex_&,_const_QList<int>_&>,_void>
           ::impl;
      *(InsertProxyModel **)(puVar8 + 4) = this;
      QObject::connectImpl
                ((QObject *)&local_40,ppvVar7,(QObject *)&local_e0,ppvVar7,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar8,(int *)CONCAT44(uVar14,1),(QMetaObject *)0x0);
      QList<QMetaObject::Connection>::emplaceBack<QMetaObject::Connection>(this_00,&local_40);
      signal = QAbstractProxyModel::sourceModel();
      local_e0.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::headerDataChanged;
      uStack_d8 = 0;
      uVar14 = 0;
      QObject::
      connect<void(QAbstractItemModel::*)(Qt::Orientation,int,int),void(QAbstractItemModel::*)(Qt::Orientation,int,int)>
                ((Object *)&local_48,signal,(Object *)QAbstractItemModel::headerDataChanged,0,
                 (ConnectionType)this);
      QList<QMetaObject::Connection>::emplaceBack<QMetaObject::Connection>(this_00,&local_48);
      ppvVar7 = (void **)QAbstractProxyModel::sourceModel();
      local_e0.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::layoutAboutToBeChanged;
      uStack_d8 = 0;
      puVar8 = (undefined4 *)operator_new(0x18);
      *puVar8 = 1;
      *(code **)(puVar8 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:275:37),_2,_QtPrivate::List<const_QList<QPersistentModelIndex>_&,_QAbstractItemModel::LayoutChangeHint>,_void>
           ::impl;
      *(InsertProxyModelPrivate **)(puVar8 + 4) = pIVar1;
      piVar13 = (int *)CONCAT44(uVar14,1);
      QObject::connectImpl
                ((QObject *)&local_50,ppvVar7,(QObject *)&local_e0,ppvVar7,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar8,piVar13,(QMetaObject *)0x0);
      uVar14 = (undefined4)((ulong)piVar13 >> 0x20);
      QList<QMetaObject::Connection>::emplaceBack<QMetaObject::Connection>(this_00,&local_50);
      ppvVar7 = (void **)QAbstractProxyModel::sourceModel();
      local_e0.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::layoutChanged;
      uStack_d8 = 0;
      puVar8 = (undefined4 *)operator_new(0x18);
      *puVar8 = 1;
      *(code **)(puVar8 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:279:37),_2,_QtPrivate::List<const_QList<QPersistentModelIndex>_&,_QAbstractItemModel::LayoutChangeHint>,_void>
           ::impl;
      *(InsertProxyModelPrivate **)(puVar8 + 4) = pIVar1;
      piVar13 = (int *)CONCAT44(uVar14,1);
      QObject::connectImpl
                ((QObject *)&local_58,ppvVar7,(QObject *)&local_e0,ppvVar7,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar8,piVar13,(QMetaObject *)0x0);
      uVar14 = (undefined4)((ulong)piVar13 >> 0x20);
      QList<QMetaObject::Connection>::emplaceBack<QMetaObject::Connection>(this_00,&local_58);
      ppvVar7 = (void **)QAbstractProxyModel::sourceModel();
      local_e0.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::columnsAboutToBeInserted;
      uStack_d8 = 0;
      puVar8 = (undefined4 *)operator_new(0x18);
      *puVar8 = 1;
      *(code **)(puVar8 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:283:37),_3,_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void>
           ::impl;
      *(InsertProxyModel **)(puVar8 + 4) = this;
      piVar13 = (int *)CONCAT44(uVar14,1);
      QObject::connectImpl
                ((QObject *)&local_60,ppvVar7,(QObject *)&local_e0,ppvVar7,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar8,piVar13,(QMetaObject *)0x0);
      uVar14 = (undefined4)((ulong)piVar13 >> 0x20);
      QList<QMetaObject::Connection>::emplaceBack<QMetaObject::Connection>(this_00,&local_60);
      ppvVar7 = (void **)QAbstractProxyModel::sourceModel();
      local_e0.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::columnsAboutToBeMoved;
      uStack_d8 = 0;
      puVar8 = (undefined4 *)operator_new(0x18);
      *puVar8 = 1;
      *(code **)(puVar8 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:289:37),_5,_QtPrivate::List<const_QModelIndex_&,_int,_int,_const_QModelIndex_&,_int>,_void>
           ::impl;
      *(InsertProxyModel **)(puVar8 + 4) = this;
      piVar13 = (int *)CONCAT44(uVar14,1);
      QObject::connectImpl
                ((QObject *)&local_68,ppvVar7,(QObject *)&local_e0,ppvVar7,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar8,piVar13,(QMetaObject *)0x0);
      uVar14 = (undefined4)((ulong)piVar13 >> 0x20);
      QList<QMetaObject::Connection>::emplaceBack<QMetaObject::Connection>(this_00,&local_68);
      ppvVar7 = (void **)QAbstractProxyModel::sourceModel();
      local_e0.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::columnsAboutToBeRemoved;
      uStack_d8 = 0;
      puVar8 = (undefined4 *)operator_new(0x18);
      *puVar8 = 1;
      *(code **)(puVar8 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:299:37),_3,_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void>
           ::impl;
      *(InsertProxyModel **)(puVar8 + 4) = this;
      piVar13 = (int *)CONCAT44(uVar14,1);
      QObject::connectImpl
                ((QObject *)&local_70,ppvVar7,(QObject *)&local_e0,ppvVar7,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar8,piVar13,(QMetaObject *)0x0);
      uVar14 = (undefined4)((ulong)piVar13 >> 0x20);
      QList<QMetaObject::Connection>::emplaceBack<QMetaObject::Connection>(this_00,&local_70);
      ppvVar7 = (void **)QAbstractProxyModel::sourceModel();
      local_e0.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::columnsInserted;
      uStack_d8 = 0;
      puVar8 = (undefined4 *)operator_new(0x18);
      *puVar8 = 1;
      *(code **)(puVar8 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:305:37),_3,_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void>
           ::impl;
      *(InsertProxyModelPrivate **)(puVar8 + 4) = pIVar1;
      piVar13 = (int *)CONCAT44(uVar14,1);
      QObject::connectImpl
                ((QObject *)&local_78,ppvVar7,(QObject *)&local_e0,ppvVar7,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar8,piVar13,(QMetaObject *)0x0);
      uVar14 = (undefined4)((ulong)piVar13 >> 0x20);
      QList<QMetaObject::Connection>::emplaceBack<QMetaObject::Connection>(this_00,&local_78);
      ppvVar7 = (void **)QAbstractProxyModel::sourceModel();
      local_e0.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::columnsRemoved;
      uStack_d8 = 0;
      puVar8 = (undefined4 *)operator_new(0x18);
      *puVar8 = 1;
      *(code **)(puVar8 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:307:37),_3,_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void>
           ::impl;
      *(InsertProxyModelPrivate **)(puVar8 + 4) = pIVar1;
      piVar13 = (int *)CONCAT44(uVar14,1);
      QObject::connectImpl
                ((QObject *)&local_80,ppvVar7,(QObject *)&local_e0,ppvVar7,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar8,piVar13,(QMetaObject *)0x0);
      uVar14 = (undefined4)((ulong)piVar13 >> 0x20);
      QList<QMetaObject::Connection>::emplaceBack<QMetaObject::Connection>(this_00,&local_80);
      ppvVar7 = (void **)QAbstractProxyModel::sourceModel();
      local_e0.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::columnsMoved;
      uStack_d8 = 0;
      puVar8 = (undefined4 *)operator_new(0x18);
      *puVar8 = 1;
      *(code **)(puVar8 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:309:37),_5,_QtPrivate::List<const_QModelIndex_&,_int,_int,_const_QModelIndex_&,_int>,_void>
           ::impl;
      *(InsertProxyModelPrivate **)(puVar8 + 4) = pIVar1;
      piVar13 = (int *)CONCAT44(uVar14,1);
      QObject::connectImpl
                ((QObject *)&local_88,ppvVar7,(QObject *)&local_e0,ppvVar7,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar8,piVar13,(QMetaObject *)0x0);
      uVar14 = (undefined4)((ulong)piVar13 >> 0x20);
      QList<QMetaObject::Connection>::emplaceBack<QMetaObject::Connection>(this_00,&local_88);
      ppvVar7 = (void **)QAbstractProxyModel::sourceModel();
      local_e0.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::rowsAboutToBeInserted;
      uStack_d8 = 0;
      puVar8 = (undefined4 *)operator_new(0x18);
      *puVar8 = 1;
      *(code **)(puVar8 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:313:37),_3,_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void>
           ::impl;
      *(InsertProxyModel **)(puVar8 + 4) = this;
      piVar13 = (int *)CONCAT44(uVar14,1);
      QObject::connectImpl
                ((QObject *)&local_90,ppvVar7,(QObject *)&local_e0,ppvVar7,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar8,piVar13,(QMetaObject *)0x0);
      uVar14 = (undefined4)((ulong)piVar13 >> 0x20);
      QList<QMetaObject::Connection>::emplaceBack<QMetaObject::Connection>(this_00,&local_90);
      ppvVar7 = (void **)QAbstractProxyModel::sourceModel();
      local_e0.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::rowsAboutToBeMoved;
      uStack_d8 = 0;
      puVar8 = (undefined4 *)operator_new(0x18);
      *puVar8 = 1;
      *(code **)(puVar8 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:319:37),_5,_QtPrivate::List<const_QModelIndex_&,_int,_int,_const_QModelIndex_&,_int>,_void>
           ::impl;
      *(InsertProxyModel **)(puVar8 + 4) = this;
      piVar13 = (int *)CONCAT44(uVar14,1);
      QObject::connectImpl
                ((QObject *)&local_98,ppvVar7,(QObject *)&local_e0,ppvVar7,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar8,piVar13,(QMetaObject *)0x0);
      uVar14 = (undefined4)((ulong)piVar13 >> 0x20);
      QList<QMetaObject::Connection>::emplaceBack<QMetaObject::Connection>(this_00,&local_98);
      ppvVar7 = (void **)QAbstractProxyModel::sourceModel();
      local_e0.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::rowsAboutToBeRemoved;
      uStack_d8 = 0;
      puVar8 = (undefined4 *)operator_new(0x18);
      *puVar8 = 1;
      *(code **)(puVar8 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:329:37),_3,_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void>
           ::impl;
      *(InsertProxyModel **)(puVar8 + 4) = this;
      piVar13 = (int *)CONCAT44(uVar14,1);
      QObject::connectImpl
                ((QObject *)&local_a0,ppvVar7,(QObject *)&local_e0,ppvVar7,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar8,piVar13,(QMetaObject *)0x0);
      uVar14 = (undefined4)((ulong)piVar13 >> 0x20);
      QList<QMetaObject::Connection>::emplaceBack<QMetaObject::Connection>(this_00,&local_a0);
      ppvVar7 = (void **)QAbstractProxyModel::sourceModel();
      local_e0.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::rowsInserted;
      uStack_d8 = 0;
      puVar8 = (undefined4 *)operator_new(0x18);
      *puVar8 = 1;
      *(code **)(puVar8 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:335:37),_3,_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void>
           ::impl;
      *(InsertProxyModelPrivate **)(puVar8 + 4) = pIVar1;
      piVar13 = (int *)CONCAT44(uVar14,1);
      QObject::connectImpl
                ((QObject *)&local_a8,ppvVar7,(QObject *)&local_e0,ppvVar7,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar8,piVar13,(QMetaObject *)0x0);
      uVar14 = (undefined4)((ulong)piVar13 >> 0x20);
      QList<QMetaObject::Connection>::emplaceBack<QMetaObject::Connection>(this_00,&local_a8);
      ppvVar7 = (void **)QAbstractProxyModel::sourceModel();
      local_e0.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::rowsRemoved;
      uStack_d8 = 0;
      puVar8 = (undefined4 *)operator_new(0x18);
      *puVar8 = 1;
      *(code **)(puVar8 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:337:37),_3,_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void>
           ::impl;
      *(InsertProxyModelPrivate **)(puVar8 + 4) = pIVar1;
      piVar13 = (int *)CONCAT44(uVar14,1);
      QObject::connectImpl
                ((QObject *)&local_b0,ppvVar7,(QObject *)&local_e0,ppvVar7,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar8,piVar13,(QMetaObject *)0x0);
      uVar14 = (undefined4)((ulong)piVar13 >> 0x20);
      QList<QMetaObject::Connection>::emplaceBack<QMetaObject::Connection>(this_00,&local_b0);
      ppvVar7 = (void **)QAbstractProxyModel::sourceModel();
      local_e0.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::rowsMoved;
      uStack_d8 = 0;
      puVar8 = (undefined4 *)operator_new(0x18);
      *puVar8 = 1;
      *(code **)(puVar8 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:339:37),_5,_QtPrivate::List<const_QModelIndex_&,_int,_int,_const_QModelIndex_&,_int>,_void>
           ::impl;
      *(InsertProxyModelPrivate **)(puVar8 + 4) = pIVar1;
      piVar13 = (int *)CONCAT44(uVar14,1);
      QObject::connectImpl
                ((QObject *)&local_b8,ppvVar7,(QObject *)&local_e0,ppvVar7,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar8,piVar13,(QMetaObject *)0x0);
      uVar14 = (undefined4)((ulong)piVar13 >> 0x20);
      QList<QMetaObject::Connection>::emplaceBack<QMetaObject::Connection>(this_00,&local_b8);
      ppvVar7 = (void **)QAbstractProxyModel::sourceModel();
      local_e0.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::modelAboutToBeReset;
      uStack_d8 = 0;
      puVar8 = (undefined4 *)operator_new(0x18);
      *puVar8 = 1;
      *(code **)(puVar8 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:342:94),_0,_QtPrivate::List<>,_void>
           ::impl;
      *(InsertProxyModel **)(puVar8 + 4) = this;
      piVar13 = (int *)CONCAT44(uVar14,1);
      QObject::connectImpl
                ((QObject *)&local_c0,ppvVar7,(QObject *)&local_e0,ppvVar7,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar8,piVar13,(QMetaObject *)0x0);
      uVar14 = (undefined4)((ulong)piVar13 >> 0x20);
      QList<QMetaObject::Connection>::emplaceBack<QMetaObject::Connection>(this_00,&local_c0);
      ppvVar7 = (void **)QAbstractProxyModel::sourceModel();
      local_e0.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::modelReset;
      uStack_d8 = 0;
      puVar8 = (undefined4 *)operator_new(0x18);
      *puVar8 = 1;
      *(code **)(puVar8 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:343:85),_0,_QtPrivate::List<>,_void>
           ::impl;
      *(InsertProxyModelPrivate **)(puVar8 + 4) = pIVar1;
      QObject::connectImpl
                ((QObject *)&local_c8,ppvVar7,(QObject *)&local_e0,ppvVar7,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar8,(int *)CONCAT44(uVar14,1),(QMetaObject *)0x0);
      QList<QMetaObject::Connection>::emplaceBack<QMetaObject::Connection>(this_00,&local_c8);
      QMetaObject::Connection::~Connection(&local_c8);
      QMetaObject::Connection::~Connection(&local_c0);
      QMetaObject::Connection::~Connection(&local_b8);
      QMetaObject::Connection::~Connection(&local_b0);
      QMetaObject::Connection::~Connection(&local_a8);
      QMetaObject::Connection::~Connection(&local_a0);
      QMetaObject::Connection::~Connection(&local_98);
      QMetaObject::Connection::~Connection(&local_90);
      QMetaObject::Connection::~Connection(&local_88);
      QMetaObject::Connection::~Connection(&local_80);
      QMetaObject::Connection::~Connection(&local_78);
      QMetaObject::Connection::~Connection(&local_70);
      QMetaObject::Connection::~Connection(&local_68);
      QMetaObject::Connection::~Connection(&local_60);
      QMetaObject::Connection::~Connection(&local_58);
      QMetaObject::Connection::~Connection(&local_50);
      QMetaObject::Connection::~Connection(&local_48);
      QMetaObject::Connection::~Connection(&local_40);
      QMetaObject::Connection::~Connection(&local_38);
      plVar9 = (long *)QAbstractProxyModel::sourceModel();
      local_e0.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )(QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                        *)0xffffffffffffffff;
      uStack_d8 = 0;
      uStack_d0 = 0;
      iVar2 = (**(code **)(*plVar9 + 0x80))(plVar9,&local_e0);
      plVar9 = (long *)QAbstractProxyModel::sourceModel();
      local_e0.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )(QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                        *)0xffffffffffffffff;
      uStack_d8 = 0;
      uStack_d0 = 0;
      iVar3 = (**(code **)(*plVar9 + 0x78))(plVar9,&local_e0);
      iVar11 = 0;
      if (0 < iVar3) {
        iVar11 = iVar3;
      }
      while (bVar12 = iVar11 != 0, iVar11 = iVar11 + -1, bVar12) {
        local_e0.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                        )(QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                          *)0x0;
        QList<QMap<int,QVariant>>::emplaceBack<QMap<int,QVariant>>
                  ((QList<QMap<int,QVariant>> *)pIVar1->m_extraData,&local_e0);
        QtPrivate::
        QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
        ::~QExplicitlySharedDataPointerV2(&local_e0.d);
      }
      iVar11 = 0;
      if (0 < iVar2) {
        iVar11 = iVar2;
      }
      while (bVar12 = iVar11 != 0, iVar11 = iVar11 + -1, bVar12) {
        local_e0.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                        )(QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                          *)0x0;
        QList<QMap<int,QVariant>>::emplaceBack<QMap<int,QVariant>>
                  ((QList<QMap<int,QVariant>> *)(pIVar1->m_extraData + 1),&local_e0);
        QtPrivate::
        QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
        ::~QExplicitlySharedDataPointerV2(&local_e0.d);
      }
    }
    QAbstractItemModel::endResetModel();
  }
  return;
}

Assistant:

void InsertProxyModel::setSourceModel(QAbstractItemModel *newSourceModel)
{
    if (newSourceModel == sourceModel())
        return;
    Q_D(InsertProxyModel);
    beginResetModel();
    if (sourceModel()) {
        for (auto discIter = d->m_sourceConnections.cbegin(); discIter != d->m_sourceConnections.cend(); ++discIter)
            QObject::disconnect(*discIter);
    }
    QAbstractProxyModel::setSourceModel(newSourceModel);
    d->m_sourceConnections.clear();
    for (auto &extraData : d->m_extraData)
        extraData.clear();
    if (sourceModel()) {
        d->m_sourceConnections
                << QObject::connect(sourceModel(), &QAbstractItemModel::destroyed, [this]() -> void { setSourceModel(Q_NULLPTR); })
                << QObject::connect(sourceModel(), &QAbstractItemModel::dataChanged,
                                    [this](const QModelIndex &topLeft, const QModelIndex &bottomRight, const QVector<int> &roles) {
                                        Q_EMIT dataChanged(mapFromSource(topLeft), mapFromSource(bottomRight), roles);
                                    })
                << QObject::connect(sourceModel(), &QAbstractItemModel::headerDataChanged, this, &QAbstractItemModel::headerDataChanged)
                << QObject::connect(sourceModel(), &QAbstractItemModel::layoutAboutToBeChanged,
                                    [d](const QList<QPersistentModelIndex> &parents, QAbstractItemModel::LayoutChangeHint hint) {
                                        d->beforeLayoutChange(parents, hint);
                                    })
                << QObject::connect(sourceModel(), &QAbstractItemModel::layoutChanged,
                                    [d](const QList<QPersistentModelIndex> &parents, QAbstractItemModel::LayoutChangeHint hint) {
                                        d->afetrLayoutChange(parents, hint);
                                    })
                << QObject::connect(sourceModel(), &QAbstractItemModel::columnsAboutToBeInserted,
                                    [this](const QModelIndex &parent, int first, int last) {
                                        if (!parent.isValid()) {
                                            beginInsertColumns(QModelIndex(), first, last);
                                        }
                                    })
                << QObject::connect(sourceModel(), &QAbstractItemModel::columnsAboutToBeMoved,
                                    [this](const QModelIndex &sourceParent, int sourceStart, int sourceEnd, const QModelIndex &destinationParent,
                                           int destinationColumn) {
                                        if (sourceParent.isValid())
                                            return;
                                        if (destinationParent.isValid())
                                            beginRemoveColumns(QModelIndex(), sourceStart, sourceEnd);
                                        else
                                            beginMoveColumns(QModelIndex(), sourceStart, sourceEnd, QModelIndex(), destinationColumn);
                                    })
                << QObject::connect(sourceModel(), &QAbstractItemModel::columnsAboutToBeRemoved,
                                    [this](const QModelIndex &parent, int first, int last) {
                                        if (!parent.isValid()) {
                                            beginRemoveColumns(QModelIndex(), first, last);
                                        }
                                    })
                << QObject::connect(sourceModel(), &QAbstractItemModel::columnsInserted,
                                    [d](const QModelIndex &parent, int first, int last) -> void { d->onColumnsInserted(parent, first, last); })
                << QObject::connect(sourceModel(), &QAbstractItemModel::columnsRemoved,
                                    [d](const QModelIndex &parent, int first, int last) -> void { d->onColumnsRemoved(parent, first, last); })
                << QObject::connect(sourceModel(), &QAbstractItemModel::columnsMoved,
                                    [d](const QModelIndex &parent, int start, int end, const QModelIndex &destination, int column) -> void {
                                        d->onColumnsMoved(parent, start, end, destination, column);
                                    })
                << QObject::connect(sourceModel(), &QAbstractItemModel::rowsAboutToBeInserted,
                                    [this](const QModelIndex &parent, int first, int last) {
                                        if (!parent.isValid()) {
                                            beginInsertRows(QModelIndex(), first, last);
                                        }
                                    })
                << QObject::connect(sourceModel(), &QAbstractItemModel::rowsAboutToBeMoved,
                                    [this](const QModelIndex &sourceParent, int sourceStart, int sourceEnd, const QModelIndex &destinationParent,
                                           int destinationRow) {
                                        if (sourceParent.isValid())
                                            return;
                                        if (destinationParent.isValid())
                                            beginRemoveRows(QModelIndex(), sourceStart, sourceEnd);
                                        else
                                            beginMoveRows(QModelIndex(), sourceStart, sourceEnd, QModelIndex(), destinationRow);
                                    })
                << QObject::connect(sourceModel(), &QAbstractItemModel::rowsAboutToBeRemoved,
                                    [this](const QModelIndex &parent, int first, int last) {
                                        if (!parent.isValid()) {
                                            beginRemoveRows(QModelIndex(), first, last);
                                        }
                                    })
                << QObject::connect(sourceModel(), &QAbstractItemModel::rowsInserted,
                                    [d](const QModelIndex &parent, int first, int last) -> void { d->onRowsInserted(parent, first, last); })
                << QObject::connect(sourceModel(), &QAbstractItemModel::rowsRemoved,
                                    [d](const QModelIndex &parent, int first, int last) -> void { d->onRowsRemoved(parent, first, last); })
                << QObject::connect(sourceModel(), &QAbstractItemModel::rowsMoved,
                                    [d](const QModelIndex &parent, int start, int end, const QModelIndex &destination, int row) -> void {
                                        d->onRowsMoved(parent, start, end, destination, row);
                                    })
                << QObject::connect(sourceModel(), &QAbstractItemModel::modelAboutToBeReset, [this]() -> void { beginResetModel(); })
                << QObject::connect(sourceModel(), &QAbstractItemModel::modelReset, [d]() -> void { d->afterReset(); });
        const int sourceCols = sourceModel()->columnCount();
        const int sourceRows = sourceModel()->rowCount();
        for (int i = 0; i < sourceRows; ++i)
            d->m_extraData[0].append(RolesContainer());
        for (int i = 0; i < sourceCols; ++i)
            d->m_extraData[1].append(RolesContainer());
    }

    endResetModel();
}